

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O1

bool __thiscall iDynTree::AttitudeQuaternionEKF::propagateStates(AttitudeQuaternionEKF *this)

{
  DiscreteExtendedKalmanFilterHelper *this_00;
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  pointer peVar5;
  double *pdVar6;
  PointerType ptr;
  Span<double,__1L> x_span;
  Span<double,__1L> Omega_y_span;
  Span<double,__1L> local_98;
  Span<double,__1L> local_88;
  double local_78;
  double dStack_70;
  double local_68;
  
  local_88.storage_.data_ = (this->m_Omega_y).m_data;
  local_88.storage_.super_extent_type<_1L>.size_ = 3;
  this_00 = &this->super_DiscreteExtendedKalmanFilterHelper;
  bVar2 = DiscreteExtendedKalmanFilterHelper::ekfSetInputVector(this_00,&local_88);
  bVar3 = DiscreteExtendedKalmanFilterHelper::ekfPredict(this_00);
  peVar5 = (pointer)iDynTree::VectorDynSize::data();
  local_98.storage_.super_extent_type<_1L>.size_ = iDynTree::VectorDynSize::size();
  local_98.storage_.data_ = peVar5;
  bVar4 = DiscreteExtendedKalmanFilterHelper::ekfGetStates(this_00,&local_98);
  if (!bVar4) {
    iDynTree::reportError
              ("AttitudeQuaternionEKF","updateFilterWithMeasurements",
               "could not get recent state estimate");
  }
  else {
    pdVar6 = (double *)iDynTree::VectorDynSize::data();
    iDynTree::VectorDynSize::size();
    dVar1 = pdVar6[1];
    (this->m_state_qekf).m_orientation.m_data[0] = *pdVar6;
    (this->m_state_qekf).m_orientation.m_data[1] = dVar1;
    dVar1 = pdVar6[3];
    (this->m_state_qekf).m_orientation.m_data[2] = pdVar6[2];
    (this->m_state_qekf).m_orientation.m_data[3] = dVar1;
    dVar1 = pdVar6[5];
    (this->m_state_qekf).m_angular_velocity.m_data[0] = pdVar6[4];
    (this->m_state_qekf).m_angular_velocity.m_data[1] = dVar1;
    (this->m_state_qekf).m_angular_velocity.m_data[2] = pdVar6[6];
    dVar1 = pdVar6[8];
    (this->m_state_qekf).m_gyroscope_bias.m_data[0] = pdVar6[7];
    (this->m_state_qekf).m_gyroscope_bias.m_data[1] = dVar1;
    (this->m_state_qekf).m_gyroscope_bias.m_data[2] = pdVar6[9];
    iDynTree::Rotation::RotationFromQuaternion
              ((Rotation *)&local_78,(VectorFixSize *)&this->m_state_qekf);
    iDynTree::Rotation::operator=(&this->m_orientationInSO3,(Rotation *)&local_78);
    iDynTree::Rotation::asRPY();
    (this->m_orientationInRPY).m_data[2] = local_68;
    (this->m_orientationInRPY).m_data[0] = local_78;
    (this->m_orientationInRPY).m_data[1] = dStack_70;
  }
  return bVar4 && (bVar2 && bVar3);
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::propagateStates()
{
    iDynTree::Span<double> Omega_y_span(m_Omega_y.data(), m_Omega_y.size());
    bool ok  = ekfSetInputVector(Omega_y_span);
    ok = ekfPredict() && ok;
    iDynTree::Span<double> x_span(m_x.data(), m_x.size());
    if (ekfGetStates(x_span))
    {
        deserializeStateVector();
        m_orientationInSO3 = iDynTree::Rotation::RotationFromQuaternion(m_state_qekf.m_orientation);
        m_orientationInRPY = m_orientationInSO3.asRPY();
    }
    else
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "updateFilterWithMeasurements", "could not get recent state estimate");
        return false;
    }
    return ok;
}